

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::_InternalSerialize
          (BayesianProbitRegressor_Gaussian *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int size;
  uint8_t *puVar2;
  void *data;
  double dVar3;
  uint64_t raw_precision;
  double tmp_precision;
  uint64_t raw_mean;
  double tmp_mean;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  BayesianProbitRegressor_Gaussian *this_local;
  
  dVar3 = _internal_mean(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (dVar3 != 0.0) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    dVar3 = _internal_mean(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray(1,dVar3,puVar2);
  }
  dVar3 = _internal_precision(this);
  if (dVar3 != 0.0) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    dVar3 = _internal_precision(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray(2,dVar3,puVar2);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* BayesianProbitRegressor_Gaussian::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // double mean = 1;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_mean = this->_internal_mean();
  uint64_t raw_mean;
  memcpy(&raw_mean, &tmp_mean, sizeof(tmp_mean));
  if (raw_mean != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(1, this->_internal_mean(), target);
  }

  // double precision = 2;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_precision = this->_internal_precision();
  uint64_t raw_precision;
  memcpy(&raw_precision, &tmp_precision, sizeof(tmp_precision));
  if (raw_precision != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(2, this->_internal_precision(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  return target;
}